

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

uint32 add_ctab_bytes(Context_conflict2 *ctx,uint8 *bytes,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  uint32 retval;
  ssize_t pos;
  size_t extra;
  size_t len_local;
  uint8 *bytes_local;
  Context_conflict2 *ctx_local;
  
  iVar1 = isfail(ctx);
  if (iVar1 == 0) {
    sVar2 = buffer_find(ctx->ctab,0x20,bytes,len);
    if (sVar2 < 0) {
      sVar3 = buffer_size(ctx->ctab);
      ctx_local._4_4_ = (int)sVar3 - 4;
      buffer_append(ctx->ctab,bytes,len);
    }
    else {
      ctx_local._4_4_ = (int)sVar2 - 4;
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static uint32 add_ctab_bytes(Context *ctx, const uint8 *bytes, const size_t len)
{
    if (isfail(ctx))
        return 0;

    const size_t extra = CTAB_SIZE + sizeof (uint32);
    const ssize_t pos = buffer_find(ctx->ctab, extra, bytes, len);
    if (pos >= 0)  // blob is already in here.
        return ((uint32) pos) - sizeof (uint32);

    // add it to the byte pile...
    const uint32 retval = ((uint32) buffer_size(ctx->ctab)) - sizeof (uint32);
    buffer_append(ctx->ctab, bytes, len);
    return retval;
}